

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psintrp.c
# Opt level: O1

void cf2_doFlex(CF2_Stack opStack,CF2_F16Dot16 *curX,CF2_F16Dot16 *curY,CF2_GlyphPath glyphPath,
               FT_Bool *readFromStack,FT_Bool doConditionalLastRead)

{
  FT_Bool FVar1;
  int iVar2;
  int iVar3;
  CF2_F16Dot16 CVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  FT_UFast idx;
  undefined7 in_register_00000089;
  int *piVar8;
  int *piVar9;
  undefined8 local_80;
  undefined8 local_78;
  CF2_F16Dot16 CStack_70;
  CF2_F16Dot16 local_6c [3];
  int aiStack_60 [8];
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  
  local_6c[0] = (CF2_F16Dot16)CONCAT71(in_register_00000089,doConditionalLastRead);
  local_6c[1] = *curX;
  local_6c[2] = *curY;
  FVar1 = readFromStack[9];
  lVar7 = 0;
  idx = 0;
  local_80 = curY;
  local_78 = curX;
  do {
    iVar2 = local_6c[lVar7 + 1];
    aiStack_60[lVar7] = iVar2;
    if (readFromStack[lVar7] != '\0') {
      CVar4 = cf2_stack_getReal(opStack,idx);
      aiStack_60[lVar7] = CVar4 + iVar2;
      idx = idx + 1;
    }
    piVar9 = local_78;
    piVar8 = local_80;
    lVar7 = lVar7 + 1;
  } while (10 - (ulong)(FVar1 == '\0') != lVar7);
  if (FVar1 == '\0') {
    local_3c = *local_80;
  }
  iVar2 = local_3c;
  if ((char)local_6c[0] == '\0') {
    if (readFromStack[10] == '\0') {
      local_38 = *local_78;
    }
    else {
      CVar4 = cf2_stack_getReal(opStack,idx);
      local_38 = CVar4 + local_40;
      idx = idx + 1;
    }
    iVar2 = local_3c;
    if (readFromStack[0xb] != '\0') {
      CVar4 = cf2_stack_getReal(opStack,idx);
      local_34 = CVar4 + iVar2;
      piVar8 = local_80;
      goto LAB_00239f97;
    }
    local_34 = *local_80;
    piVar8 = local_80;
  }
  else {
    iVar5 = local_40 - *local_78;
    iVar3 = -iVar5;
    if (0 < iVar5) {
      iVar3 = iVar5;
    }
    iVar6 = local_3c - *local_80;
    iVar5 = -iVar6;
    if (0 < iVar6) {
      iVar5 = iVar6;
    }
    CVar4 = cf2_stack_getReal(opStack,idx);
    piVar9 = local_78;
    if (iVar5 < iVar3) {
      local_38 = CVar4 + local_40;
      local_34 = *piVar8;
      goto LAB_00239f97;
    }
    local_38 = *local_78;
    local_34 = CVar4 + iVar2;
  }
LAB_00239f97:
  lVar7 = 0x1c;
  do {
    cf2_glyphpath_curveTo
              (glyphPath,*(CF2_F16Dot16 *)((long)&local_80 + lVar7 + 4),
               *(CF2_F16Dot16 *)((long)&local_78 + lVar7),
               *(CF2_F16Dot16 *)((long)&local_78 + lVar7 + 4),
               *(CF2_F16Dot16 *)((long)&CStack_70 + lVar7),*(CF2_F16Dot16 *)((long)local_6c + lVar7)
               ,*(CF2_F16Dot16 *)((long)local_6c + lVar7 + 4));
    lVar7 = lVar7 + 0x18;
  } while (lVar7 == 0x34);
  opStack->top = opStack->buffer;
  *piVar9 = local_38;
  *piVar8 = local_34;
  return;
}

Assistant:

static void
  cf2_doFlex( CF2_Stack       opStack,
              CF2_Fixed*      curX,
              CF2_Fixed*      curY,
              CF2_GlyphPath   glyphPath,
              const FT_Bool*  readFromStack,
              FT_Bool         doConditionalLastRead )
  {
    CF2_Fixed  vals[14];
    CF2_UInt   idx;
    FT_Bool    isHFlex;
    CF2_Int    top, i, j;


    vals[0] = *curX;
    vals[1] = *curY;
    idx     = 0;
    isHFlex = FT_BOOL( readFromStack[9] == FALSE );
    top     = isHFlex ? 9 : 10;

    for ( i = 0; i < top; i++ )
    {
      vals[i + 2] = vals[i];
      if ( readFromStack[i] )
        vals[i + 2] = ADD_INT32( vals[i + 2], cf2_stack_getReal( opStack,
                                                                 idx++ ) );
    }

    if ( isHFlex )
      vals[9 + 2] = *curY;

    if ( doConditionalLastRead )
    {
      FT_Bool    lastIsX = FT_BOOL(
                             cf2_fixedAbs( SUB_INT32( vals[10], *curX ) ) >
                             cf2_fixedAbs( SUB_INT32( vals[11], *curY ) ) );
      CF2_Fixed  lastVal = cf2_stack_getReal( opStack, idx );


      if ( lastIsX )
      {
        vals[12] = ADD_INT32( vals[10], lastVal );
        vals[13] = *curY;
      }
      else
      {
        vals[12] = *curX;
        vals[13] = ADD_INT32( vals[11], lastVal );
      }
    }
    else
    {
      if ( readFromStack[10] )
        vals[12] = ADD_INT32( vals[10],
                              cf2_stack_getReal( opStack, idx++ ) );
      else
        vals[12] = *curX;

      if ( readFromStack[11] )
        vals[13] = ADD_INT32( vals[11],
                              cf2_stack_getReal( opStack, idx ) );
      else
        vals[13] = *curY;
    }

    for ( j = 0; j < 2; j++ )
      cf2_glyphpath_curveTo( glyphPath, vals[j * 6 + 2],
                                        vals[j * 6 + 3],
                                        vals[j * 6 + 4],
                                        vals[j * 6 + 5],
                                        vals[j * 6 + 6],
                                        vals[j * 6 + 7] );

    cf2_stack_clear( opStack );

    *curX = vals[12];
    *curY = vals[13];
  }